

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O1

Wlc_Ntk_t * Wlc_ReadNdr(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  int *pData;
  void *__ptr;
  int *__ptr_00;
  Wlc_Ntk_t *pWVar3;
  Abc_Frame_t *pAbc;
  size_t __size;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pData = (int *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
  }
  else {
    pData = (int *)0x0;
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    if ((int)lVar2 * -0x33333333 + 0x19999999U < 0x33333333) {
      iVar1 = (int)lVar2 / 5;
      rewind(__stream);
      pData = (int *)malloc(0x18);
      pData[1] = iVar1;
      *pData = iVar1;
      __size = (size_t)iVar1;
      __ptr = malloc(__size);
      *(void **)(pData + 2) = __ptr;
      __ptr_00 = (int *)malloc((long)(iVar1 * 4) << 2);
      *(int **)(pData + 4) = __ptr_00;
      fread(__ptr_00,4,__size,__stream);
      fread(__ptr,1,__size,__stream);
      if (iVar1 != *__ptr_00) {
        __assert_fail("p->nSize == (int)p->pBody[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                      ,0x25f,"void *Ndr_Read(char *)");
      }
      fclose(__stream);
    }
  }
  pWVar3 = Wlc_NtkFromNdr(pData);
  pAbc = Abc_FrameGetGlobalFrame();
  Abc_FrameInputNdr(pAbc,pData);
  return pWVar3;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadNdr( char * pFileName )
{
    void * pData = Ndr_Read( pFileName );
    Wlc_Ntk_t * pNtk = Wlc_NtkFromNdr( pData );
    //char * ppNames[10] = { NULL, "a", "b", "c", "d", "e", "f", "g", "h", "i" };
    //Ndr_WriteVerilog( NULL, pData, ppNames );
    //Ndr_Delete( pData );
    Abc_FrameInputNdr( Abc_FrameGetGlobalFrame(), pData );
    return pNtk;
}